

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

uint __thiscall doctest::String::size(String *this)

{
  size_t sVar1;
  
  if (this->m_str != (char *)0x0) {
    sVar1 = detail::my_strlen(this->m_str);
    return (uint)sVar1;
  }
  return 0;
}

Assistant:

unsigned String::size() const { return m_str ? detail::my_strlen(m_str) : 0; }